

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_table.cpp
# Opt level: O1

void state_machine::show_string(char *s,int _pos)

{
  undefined8 in_RAX;
  size_t sVar1;
  ostream *poVar2;
  int iVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x127200);
  }
  else {
    sVar1 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  iVar3 = _pos;
  if (0 < _pos) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  uStack_28 = CONCAT17(0x5e,(undefined7)uStack_28);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pos: ",5);
  std::ostream::operator<<((ostream *)&std::cout,_pos);
  return;
}

Assistant:

void show_string(const char* s, int _pos) {
        std::cout << s << std::endl;
        for (int i = 0; i < _pos; i++) {
            std::cout << " ";
        }
        std::cout << '^' << std::endl;
        std::cout << "pos: " << _pos;
    }